

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Declaration_Object.cpp
# Opt level: O0

void __thiscall
psy::C::ObjectDeclarationSymbol::ObjectDeclarationSymbol
          (ObjectDeclarationSymbol *this,SymbolKind symK,Symbol *containingSym,SyntaxTree *tree,
          Scope *enclosingScope)

{
  ObjectDeclarationImpl *this_00;
  Scope *enclosingScope_local;
  SyntaxTree *tree_local;
  Symbol *containingSym_local;
  SymbolKind symK_local;
  ObjectDeclarationSymbol *this_local;
  
  this_00 = (ObjectDeclarationImpl *)operator_new(0x38);
  ObjectDeclarationImpl::ObjectDeclarationImpl(this_00,symK,containingSym,tree,enclosingScope);
  DeclarationSymbol::DeclarationSymbol(&this->super_DeclarationSymbol,(DeclarationImpl *)this_00);
  MIXIN_NameableDeclarationSymbol::MIXIN_NameableDeclarationSymbol
            (&this->super_MIXIN_NameableDeclarationSymbol);
  MIXIN_TypeableDeclarationSymbol::MIXIN_TypeableDeclarationSymbol
            (&this->super_MIXIN_TypeableDeclarationSymbol);
  (this->super_DeclarationSymbol).super_Symbol._vptr_Symbol =
       (_func_int **)&PTR__ObjectDeclarationSymbol_007336e8;
  (this->super_MIXIN_NameableDeclarationSymbol)._vptr_MIXIN_NameableDeclarationSymbol =
       (_func_int **)&PTR__ObjectDeclarationSymbol_00733840;
  (this->super_MIXIN_TypeableDeclarationSymbol)._vptr_MIXIN_TypeableDeclarationSymbol =
       (_func_int **)&PTR__ObjectDeclarationSymbol_00733870;
  return;
}

Assistant:

ObjectDeclarationSymbol::ObjectDeclarationSymbol(SymbolKind symK,
                                                 const Symbol* containingSym,
                                                 const SyntaxTree* tree,
                                                 const Scope* enclosingScope)
    : DeclarationSymbol(
          new ObjectDeclarationImpl(symK,
                                    containingSym,
                                    tree,
                                    enclosingScope))
{}